

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

void __thiscall
ParsedSRTTrackData::extractData(ParsedSRTTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  void *pvVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  allocator<char> local_d9;
  string local_d8 [8];
  string postfix;
  string local_98;
  string local_78;
  string local_48 [8];
  string prefix;
  int size_local;
  uint8_t *buff_local;
  AVPacket *pkt_local;
  ParsedSRTTrackData *this_local;
  
  prefix.field_2._12_4_ = size;
  std::__cxx11::string::string(local_48);
  if (this->m_packetCnt == 0) {
    std::__cxx11::string::operator=(local_48,anon_var_dwarf_f633c);
  }
  this->m_packetCnt = this->m_packetCnt + 1;
  int32ToStr_abi_cxx11_(&local_78,&this->m_packetCnt);
  std::__cxx11::string::operator+=(local_48,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator+=(local_48,"\n");
  floatToTime_abi_cxx11_(&local_98,(double)pkt->pts / 5292000000.0,',');
  std::__cxx11::string::operator+=(local_48,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::operator+=(local_48," --> ");
  floatToTime_abi_cxx11_
            ((string *)((long)&postfix.field_2 + 8),
             (double)(pkt->pts + pkt->duration) / 5292000000.0,',');
  std::__cxx11::string::operator+=(local_48,(string *)(postfix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(postfix.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=(local_48,'\n');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"\n\n",&local_d9);
  std::allocator<char>::~allocator(&local_d9);
  uVar1 = prefix.field_2._12_4_;
  iVar2 = std::__cxx11::string::length();
  iVar3 = std::__cxx11::string::length();
  pkt->size = uVar1 + iVar2 + iVar3;
  puVar4 = (uint8_t *)operator_new__((long)pkt->size);
  pkt->data = puVar4;
  puVar4 = pkt->data;
  pvVar5 = (void *)std::__cxx11::string::c_str();
  sVar6 = std::__cxx11::string::length();
  memcpy(puVar4,pvVar5,sVar6);
  puVar4 = pkt->data;
  lVar7 = std::__cxx11::string::length();
  memcpy(puVar4 + lVar7,buff,(long)(int)prefix.field_2._12_4_);
  puVar4 = pkt->data;
  lVar7 = std::__cxx11::string::length();
  lVar8 = (long)(int)prefix.field_2._12_4_;
  pvVar5 = (void *)std::__cxx11::string::c_str();
  sVar6 = std::__cxx11::string::length();
  memcpy(puVar4 + lVar8 + lVar7,pvVar5,sVar6);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void ParsedSRTTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    std::string prefix;
    if (m_packetCnt == 0)
        prefix = "\xEF\xBB\xBF";  // UTF-8 header
    prefix += int32ToStr(++m_packetCnt);
    prefix += "\n";
    prefix += floatToTime(static_cast<double>(pkt->pts) / INTERNAL_PTS_FREQ, ',');
    prefix += " --> ";
    prefix += floatToTime(static_cast<double>(pkt->pts + pkt->duration) / INTERNAL_PTS_FREQ, ',');
    prefix += '\n';
    const std::string postfix = "\n\n";
    pkt->size = static_cast<int>(size + prefix.length() + postfix.length());
    pkt->data = new uint8_t[pkt->size];
    memcpy(pkt->data, prefix.c_str(), prefix.length());
    memcpy(pkt->data + prefix.length(), buff, size);
    memcpy(pkt->data + prefix.length() + size, postfix.c_str(), postfix.length());
}